

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool __thiscall
duckdb_re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  if (0 < (long)rewrite->size_) {
    pcVar5 = rewrite->data_;
    pcVar4 = pcVar5 + rewrite->size_;
    do {
      if (*pcVar5 == '\\') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 < pcVar4) {
          uVar1 = (int)*pcVar5 - 0x30;
          if (uVar1 < 10) {
            if (veclen <= (int)uVar1) {
              if ((this->options_).log_errors_ != true) {
                return false;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"invalid substitution \\",0x16);
              poVar3 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,uVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3," from ",6);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,veclen);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3," groups",7);
              goto LAB_01824f64;
            }
            if (vec[uVar1].size_ != 0) {
              std::__cxx11::string::append((char *)out,(ulong)vec[uVar1].data_);
            }
            goto LAB_01824e51;
          }
          if (*pcVar5 == '\\') goto LAB_01824e4c;
        }
        if ((this->options_).log_errors_ != true) {
          return false;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"invalid rewrite pattern: ",0x19);
        pcVar5 = rewrite->data_;
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)(ostringstream *)local_1a8 +
                          (int)*(undefined8 *)(local_1a8[0] + -0x18));
        }
        else {
          sVar2 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar2);
        }
LAB_01824f64:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
LAB_01824e4c:
      std::__cxx11::string::push_back((char)out);
LAB_01824e51:
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 < pcVar4);
  }
  return true;
}

Assistant:

static inline std::string* empty_string() {
  return &reinterpret_cast<EmptyStorage*>(empty_storage)->empty_string;
}